

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplaceRealloc<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,pointer pos,
          pair<unsigned_long,_unsigned_long> *args)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  pointer ppVar6;
  pair<unsigned_long,_unsigned_long> *__cur;
  unsigned_long *puVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - *(long *)this;
  ctx = (EVP_PKEY_CTX *)0x10;
  puVar5 = (unsigned_long *)detail::allocArray(capacity,0x10);
  uVar4 = args->second;
  *(unsigned_long *)((long)puVar5 + lVar8) = args->first;
  ((unsigned_long *)((long)puVar5 + lVar8))[1] = uVar4;
  ppVar6 = *(pointer *)this;
  puVar7 = puVar5;
  if (ppVar6 + *(long *)(this + 8) == pos) {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      uVar4 = ppVar6->second;
      *puVar7 = ppVar6->first;
      puVar7[1] = uVar4;
      puVar7 = puVar7 + 2;
    }
  }
  else {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      uVar4 = ppVar6->second;
      *puVar7 = ppVar6->first;
      puVar7[1] = uVar4;
      puVar7 = puVar7 + 2;
    }
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)this;
    puVar7 = (unsigned_long *)((long)puVar5 + lVar8);
    for (; pos != (pointer)(lVar2 * 0x10 + lVar3); pos = pos + 1) {
      uVar4 = pos->second;
      puVar7[2] = pos->first;
      puVar7[3] = uVar4;
      puVar7 = puVar7 + 2;
    }
  }
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::cleanup
            ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(unsigned_long **)this = puVar5;
  return (pointer)((long)puVar5 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}